

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_validate_value(lysp_ctx *ctx,yang_arg val_type,char *val)

{
  LY_ERR LVar1;
  uint8_t *prefix_00;
  ly_ctx *plVar2;
  ly_bool first;
  uint8_t prefix;
  uint32_t c;
  char *val_local;
  size_t utf8_char_len;
  
  prefix = '\0';
  val_local = val;
  if (val == (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar2 = (ly_ctx *)0x0;
    }
    else {
      plVar2 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX,"Missing an expected string.");
LAB_0016a6c1:
    LVar1 = LY_EVALID;
  }
  else {
    first = '\x01';
    while (*val_local != '\0') {
      LVar1 = ly_getutf8(&val_local,&c,&utf8_char_len);
      if (LVar1 != LY_SUCCESS) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar2 = (ly_ctx *)0x0;
        }
        else {
          plVar2 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
                (ulong)(uint)(int)val_local[-utf8_char_len]);
        goto LAB_0016a6c1;
      }
      if (val_type - Y_STR_ARG < 2) {
        LVar1 = lysp_check_stringchar(ctx,c);
      }
      else {
        if (val_type == Y_PREF_IDENTIF_ARG) {
          prefix_00 = &prefix;
        }
        else {
          prefix_00 = (uint8_t *)0x0;
        }
        LVar1 = lysp_check_identifierchar(ctx,c,first,prefix_00);
      }
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      first = '\0';
    }
    LVar1 = LY_SUCCESS;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lysp_stmt_validate_value(struct lysp_ctx *ctx, enum yang_arg val_type, const char *val)
{
    uint8_t prefix = 0;
    ly_bool first = 1;
    uint32_t c;
    size_t utf8_char_len;

    if (!val) {
        if (val_type == Y_MAYBE_STR_ARG) {
            /* fine */
            return LY_SUCCESS;
        }

        LOGVAL_PARSER(ctx, LYVE_SYNTAX, "Missing an expected string.");
        return LY_EVALID;
    }

    while (*val) {
        LY_CHECK_ERR_RET(ly_getutf8(&val, &c, &utf8_char_len),
                LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, (val)[-utf8_char_len]), LY_EVALID);

        switch (val_type) {
        case Y_IDENTIF_ARG:
            LY_CHECK_RET(lysp_check_identifierchar(ctx, c, first, NULL));
            break;
        case Y_PREF_IDENTIF_ARG:
            LY_CHECK_RET(lysp_check_identifierchar(ctx, c, first, &prefix));
            break;
        case Y_STR_ARG:
        case Y_MAYBE_STR_ARG:
            LY_CHECK_RET(lysp_check_stringchar(ctx, c));
            break;
        }
        first = 0;
    }

    return LY_SUCCESS;
}